

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcClosedShell::~IfcClosedShell(IfcClosedShell *this)

{
  ~IfcClosedShell((IfcClosedShell *)
                  &this[-1].super_IfcConnectedFaceSet.super_IfcTopologicalRepresentationItem.
                   field_0x28);
  return;
}

Assistant:

IfcClosedShell() : Object("IfcClosedShell") {}